

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O0

matrix3d * tinyusdz::to_matrix3x3(matrix3d *__return_storage_ptr__,matrix4d *m44,double3 *tx)

{
  value_type_conflict3 vVar1;
  reference pvVar2;
  matrix3d *m;
  double3 *tx_local;
  matrix4d *m44_local;
  
  value::matrix3d::matrix3d(__return_storage_ptr__);
  Identity(__return_storage_ptr__);
  __return_storage_ptr__->m[0][0] = m44->m[0][0];
  __return_storage_ptr__->m[0][1] = m44->m[0][1];
  __return_storage_ptr__->m[0][2] = m44->m[0][2];
  __return_storage_ptr__->m[1][0] = m44->m[1][0];
  __return_storage_ptr__->m[1][1] = m44->m[1][1];
  __return_storage_ptr__->m[1][2] = m44->m[1][2];
  __return_storage_ptr__->m[2][0] = m44->m[2][0];
  __return_storage_ptr__->m[2][1] = m44->m[2][1];
  __return_storage_ptr__->m[2][2] = m44->m[2][2];
  if (tx != (double3 *)0x0) {
    vVar1 = m44->m[3][0];
    pvVar2 = std::array<double,_3UL>::operator[](tx,0);
    *pvVar2 = vVar1;
    vVar1 = m44->m[3][1];
    pvVar2 = std::array<double,_3UL>::operator[](tx,1);
    *pvVar2 = vVar1;
    vVar1 = m44->m[3][2];
    pvVar2 = std::array<double,_3UL>::operator[](tx,2);
    *pvVar2 = vVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

value::matrix3d to_matrix3x3(const value::matrix4d &m44, value::double3 *tx) {
  value::matrix3d m;
  Identity(&m);

  m.m[0][0] = m44.m[0][0];
  m.m[0][1] = m44.m[0][1];
  m.m[0][2] = m44.m[0][2];
  m.m[1][0] = m44.m[1][0];
  m.m[1][1] = m44.m[1][1];
  m.m[1][2] = m44.m[1][2];
  m.m[2][0] = m44.m[2][0];
  m.m[2][1] = m44.m[2][1];
  m.m[2][2] = m44.m[2][2];

  if (tx) {
    (*tx)[0] = m44.m[3][0];
    (*tx)[1] = m44.m[3][1];
    (*tx)[2] = m44.m[3][2];
  }

  return m;
}